

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_GroundLogisticsVehicle.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_GroundLogisticsVehicle::Encode
          (GED_GroundLogisticsVehicle *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GED_GroundLogisticsVehicle *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16EntityID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[0]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[1]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[2]);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_EA).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[0]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[1]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[2]);
  KDataStream::operator<<(pKVar1,this->m_i8Spd);
  return;
}

Assistant:

void GED_GroundLogisticsVehicle::Encode( KDataStream & stream ) const
{
    stream << m_ui16EntityID
           << m_i16Offsets[0]
           << m_i16Offsets[1]
           << m_i16Offsets[2]
           << KDIS_STREAM m_EA
           << m_i8Ori[0]
           << m_i8Ori[1]
           << m_i8Ori[2]
           << m_i8Spd;
}